

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.cc
# Opt level: O1

void scryptBlockMix(block_t *out,block_t *B,uint64_t r)

{
  uint *puVar1;
  int *piVar2;
  ulong uVar3;
  size_t i;
  long lVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  block_t X;
  uint local_13c;
  uint local_138 [20];
  ulong local_e8;
  block_t *local_d0;
  undefined8 local_78;
  ulong uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (out != B) {
    local_48 = *(undefined8 *)(B[r * 2 + -1].words + 0xc);
    uStack_40 = *(undefined8 *)(B[r * 2 + -1].words + 0xc + 2);
    local_58 = *(undefined8 *)(B[r * 2 + -1].words + 8);
    uStack_50 = *(undefined8 *)(B[r * 2 + -1].words + 8 + 2);
    local_68 = *(undefined8 *)(B[r * 2 + -1].words + 4);
    uStack_60 = *(undefined8 *)(B[r * 2 + -1].words + 4 + 2);
    local_78 = *(undefined8 *)B[r * 2 + -1].words;
    uStack_70 = *(ulong *)(B[r * 2 + -1].words + 2);
    if (r * 2 != 0) {
      uVar6 = 0;
      do {
        lVar4 = 0;
        do {
          puVar1 = (uint *)((long)&local_78 + lVar4 * 4);
          *puVar1 = *puVar1 ^ B->words[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        local_138[0] = (uint)local_78;
        local_138[1] = (uint)((ulong)local_78 >> 0x20);
        local_138[0xc] = (uint)local_48;
        local_138[0xd] = (uint)((ulong)local_48 >> 0x20);
        local_138[4] = (uint)local_68;
        local_138[5] = (uint)((ulong)local_68 >> 0x20);
        local_138[8] = (uint)local_58;
        local_138[9] = (uint)((ulong)local_58 >> 0x20);
        local_138[10] = (uint)uStack_50;
        local_138[6] = (uint)uStack_60;
        local_138[0xe] = (uint)uStack_40;
        local_e8 = uStack_70 & 0xffffffff;
        local_138[0xf] = (uint)((ulong)uStack_40 >> 0x20);
        local_138[0xb] = (uint)((ulong)uStack_50 >> 0x20);
        local_138[3] = (uint)(uStack_70 >> 0x20);
        local_13c = 10;
        local_138[7] = (uint)((ulong)uStack_60 >> 0x20);
        do {
          local_138[4] = ((local_138[0xc] + local_138[0]) * 0x80 |
                         local_138[0xc] + local_138[0] >> 0x19) ^ local_138[4];
          local_138[8] = ((local_138[4] + local_138[0]) * 0x200 |
                         local_138[4] + local_138[0] >> 0x17) ^ local_138[8];
          local_138[0xc] =
               ((local_138[8] + local_138[4]) * 0x2000 | local_138[8] + local_138[4] >> 0x13) ^
               local_138[0xc];
          uVar8 = local_138[0xc] + local_138[8];
          local_138[9] = ((local_138[1] + local_138[5]) * 0x80 | local_138[1] + local_138[5] >> 0x19
                         ) ^ local_138[9];
          local_138[0xd] =
               ((local_138[9] + local_138[5]) * 0x200 | local_138[9] + local_138[5] >> 0x17) ^
               local_138[0xd];
          local_138[1] = ((local_138[0xd] + local_138[9]) * 0x2000 |
                         local_138[0xd] + local_138[9] >> 0x13) ^ local_138[1];
          uVar7 = local_138[1] + local_138[0xd];
          local_138[0] = (uVar8 * 0x40000 | uVar8 >> 0xe) ^ local_138[0];
          local_138[0xe] =
               ((local_138[6] + local_138[10]) * 0x80 | local_138[6] + local_138[10] >> 0x19) ^
               local_138[0xe];
          local_e8._0_4_ =
               ((local_138[0xe] + local_138[10]) * 0x200 | local_138[0xe] + local_138[10] >> 0x17) ^
               (uint)local_e8;
          local_138[6] = ((local_138[0xe] + (uint)local_e8) * 0x2000 |
                         local_138[0xe] + (uint)local_e8 >> 0x13) ^ local_138[6];
          uVar8 = local_138[6] + (uint)local_e8;
          local_138[5] = (uVar7 * 0x40000 | uVar7 >> 0xe) ^ local_138[5];
          local_138[3] = ((local_138[0xb] + local_138[0xf]) * 0x80 |
                         local_138[0xb] + local_138[0xf] >> 0x19) ^ local_138[3];
          local_138[7] = ((local_138[3] + local_138[0xf]) * 0x200 |
                         local_138[3] + local_138[0xf] >> 0x17) ^ local_138[7];
          local_138[0xb] =
               ((local_138[7] + local_138[3]) * 0x2000 | local_138[7] + local_138[3] >> 0x13) ^
               local_138[0xb];
          uVar7 = local_138[0xb] + local_138[7];
          local_138[10] = (uVar8 * 0x40000 | uVar8 >> 0xe) ^ local_138[10];
          local_138[1] = ((local_138[3] + local_138[0]) * 0x80 | local_138[3] + local_138[0] >> 0x19
                         ) ^ local_138[1];
          local_138[2] = ((local_138[1] + local_138[0]) * 0x200 |
                         local_138[1] + local_138[0] >> 0x17) ^ (uint)local_e8;
          local_e8 = (ulong)local_138[2];
          local_138[3] = ((local_138[2] + local_138[1]) * 0x2000 |
                         local_138[2] + local_138[1] >> 0x13) ^ local_138[3];
          local_138[0xf] = (uVar7 * 0x40000 | uVar7 >> 0xe) ^ local_138[0xf];
          local_138[6] = ((local_138[5] + local_138[4]) * 0x80 | local_138[5] + local_138[4] >> 0x19
                         ) ^ local_138[6];
          local_138[7] = ((local_138[6] + local_138[5]) * 0x200 |
                         local_138[6] + local_138[5] >> 0x17) ^ local_138[7];
          local_138[4] = ((local_138[7] + local_138[6]) * 0x2000 |
                         local_138[7] + local_138[6] >> 0x13) ^ local_138[4];
          local_138[0] = ((local_138[3] + local_138[2]) * 0x40000 |
                         local_138[3] + local_138[2] >> 0xe) ^ local_138[0];
          local_138[0xb] =
               ((local_138[10] + local_138[9]) * 0x80 | local_138[10] + local_138[9] >> 0x19) ^
               local_138[0xb];
          local_138[8] = ((local_138[10] + local_138[0xb]) * 0x200 |
                         local_138[10] + local_138[0xb] >> 0x17) ^ local_138[8];
          local_138[9] = ((local_138[8] + local_138[0xb]) * 0x2000 |
                         local_138[8] + local_138[0xb] >> 0x13) ^ local_138[9];
          local_138[5] = ((local_138[4] + local_138[7]) * 0x40000 |
                         local_138[4] + local_138[7] >> 0xe) ^ local_138[5];
          local_138[0xc] =
               ((local_138[0xe] + local_138[0xf]) * 0x80 | local_138[0xe] + local_138[0xf] >> 0x19)
               ^ local_138[0xc];
          local_138[0xd] =
               ((local_138[0xc] + local_138[0xf]) * 0x200 | local_138[0xc] + local_138[0xf] >> 0x17)
               ^ local_138[0xd];
          local_138[0xe] =
               ((local_138[0xd] + local_138[0xc]) * 0x2000 | local_138[0xd] + local_138[0xc] >> 0x13
               ) ^ local_138[0xe];
          local_138[10] =
               ((local_138[9] + local_138[8]) * 0x40000 | local_138[9] + local_138[8] >> 0xe) ^
               local_138[10];
          local_138[0xf] =
               ((local_138[0xe] + local_138[0xd]) * 0x40000 | local_138[0xe] + local_138[0xd] >> 0xe
               ) ^ local_138[0xf];
          local_13c = local_13c - 2;
        } while (2 < local_13c);
        lVar4 = 0;
        do {
          piVar2 = (int *)((long)&local_78 + lVar4 * 4);
          *piVar2 = *piVar2 + local_138[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        uVar5 = 0;
        if ((uVar6 & 1) != 0) {
          uVar5 = r;
        }
        uVar3 = uVar6 & 0x7fffffffffffffe;
        *(undefined8 *)(out[uVar5].words + uVar3 * 8 + 0xc) = local_48;
        *(undefined8 *)(out[uVar5].words + uVar3 * 8 + 0xc + 2) = uStack_40;
        *(undefined8 *)(out[uVar5].words + uVar3 * 8 + 8) = local_58;
        *(undefined8 *)(out[uVar5].words + uVar3 * 8 + 8 + 2) = uStack_50;
        *(undefined8 *)(out[uVar5].words + uVar3 * 8 + 4) = local_68;
        *(undefined8 *)(out[uVar5].words + uVar3 * 8 + 4 + 2) = uStack_60;
        *(undefined8 *)(out[uVar5].words + uVar3 * 8) = local_78;
        *(ulong *)(out[uVar5].words + uVar3 * 8 + 2) = uStack_70;
        uVar6 = uVar6 + 1;
        B = B + 1;
      } while (uVar6 != r * 2);
    }
    return;
  }
  local_d0 = out;
  __assert_fail("out != B",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/scrypt.cc"
                ,99,"void scryptBlockMix(block_t *, const block_t *, uint64_t)");
}

Assistant:

static void scryptBlockMix(block_t *out, const block_t *B, uint64_t r) {
  assert(out != B);

  block_t X;
  OPENSSL_memcpy(&X, &B[r * 2 - 1], sizeof(X));
  for (uint64_t i = 0; i < r * 2; i++) {
    xor_block(&X, &X, &B[i]);
    salsa208_word_specification(&X);

    // This implements the permutation in step 3.
    OPENSSL_memcpy(&out[i / 2 + (i & 1) * r], &X, sizeof(X));
  }
}